

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<CallArgumentData,_16U>::~SmallArray(SmallArray<CallArgumentData,_16U> *this)

{
  CallArgumentData *pCVar1;
  
  pCVar1 = this->data;
  if (pCVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pCVar1 != (CallArgumentData *)0x0) {
        (*(code *)NULLC::dealloc)(pCVar1);
      }
    }
    else if (pCVar1 != (CallArgumentData *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}